

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_model_component.cpp
# Opt level: O0

bool __thiscall
ON_ModelComponent::SetDeletedModelComponentState
          (ON_ModelComponent *this,bool bDeleted,ON_ComponentManifest *manifest)

{
  ON_UUID item_id;
  ON_UUID parent_id;
  ON_ComponentManifest *this_00;
  bool bIsDeleted;
  bool bVar1;
  ON_UUID *pOVar2;
  ON__UINT64 OVar3;
  wchar_t *pwVar4;
  ON_ComponentManifestItem *this_01;
  bool local_da;
  bool local_d9;
  uchar local_d8 [8];
  uchar local_d0 [8];
  ON_ComponentManifestItem *undeleted_manifest_item;
  ON_wString assigned_name;
  undefined1 local_80 [32];
  ON_wString candidate_name;
  ON_ComponentManifestItem *deleted_manifest_item;
  bool local_41;
  uchar auStack_40 [8];
  bool bComponentInManifest;
  uchar local_38 [8];
  uchar local_30 [8];
  ON_ComponentManifestItem *manifest_item;
  ON_ComponentManifest *pOStack_20;
  ON_ComponentStatus component_status;
  ON_ComponentManifest *manifest_local;
  bool bDeleted_local;
  ON_ModelComponent *this_local;
  
  bIsDeleted = (bool)(-bDeleted & 1);
  pOStack_20 = manifest;
  manifest_item._6_2_ = ModelComponentStatus(this);
  bVar1 = ON_ComponentStatus::IsDeleted((ON_ComponentStatus *)((long)&manifest_item + 6));
  if (bIsDeleted == bVar1) {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_model_component.cpp"
               ,0x8f0,"","model_component deleted status = bDeleted");
  }
  else {
    ON_ComponentStatus::SetDeletedState((ON_ComponentStatus *)((long)&manifest_item + 6),bIsDeleted)
    ;
    manifest_item._4_2_ = manifest_item._6_2_;
    bVar1 = SetModelComponentStatus(this,manifest_item._6_2_);
    if (!bVar1) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_model_component.cpp"
                 ,0x8f7,"","cannot change component deleted state.");
    }
  }
  if (pOStack_20 == (ON_ComponentManifest *)0x0) {
    local_d8 = (uchar  [8])&ON_ComponentManifestItem::UnsetItem;
  }
  else {
    if ((bIsDeleted != false) || (bVar1 = ::operator==(&ON_nil_uuid,&this->m_component_id), bVar1))
    {
      local_d0 = (uchar  [8])
                 ON_ComponentManifest::ItemFromComponentRuntimeSerialNumber
                           (pOStack_20,this->m_runtime_serial_number);
    }
    else {
      auStack_40 = *(uchar (*) [8])&this->m_component_id;
      local_38 = *&(this->m_component_id).Data4;
      local_d0 = (uchar  [8])ON_ComponentManifest::ItemFromId(pOStack_20,this->m_component_id);
    }
    local_d8[0] = local_d0[0];
    local_d8[1] = local_d0[1];
    local_d8[2] = local_d0[2];
    local_d8[3] = local_d0[3];
    local_d8[4] = local_d0[4];
    local_d8[5] = local_d0[5];
    local_d8[6] = local_d0[6];
    local_d8[7] = local_d0[7];
  }
  local_30[0] = local_d8[0];
  local_30[1] = local_d8[1];
  local_30[2] = local_d8[2];
  local_30[3] = local_d8[3];
  local_30[4] = local_d8[4];
  local_30[5] = local_d8[5];
  local_30[6] = local_d8[6];
  local_30[7] = local_d8[7];
  local_d9 = false;
  if (pOStack_20 != (ON_ComponentManifest *)0x0) {
    join_0x00000010_0x00000000_ = ON_ComponentManifestItem::Id((ON_ComponentManifestItem *)local_d8)
    ;
    bVar1 = ::operator==((ON_UUID_struct *)((long)&deleted_manifest_item + 4),&this->m_component_id)
    ;
    local_d9 = false;
    if (bVar1) {
      local_da = true;
      if (bIsDeleted != false) {
        OVar3 = ON_ComponentManifestItem::ComponentRuntimeSerialNumber
                          ((ON_ComponentManifestItem *)local_30);
        local_da = OVar3 == this->m_runtime_serial_number;
      }
      local_d9 = local_da;
    }
  }
  local_41 = local_d9;
  if ((pOStack_20 != (ON_ComponentManifest *)0x0) && (local_d9 == false)) {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_model_component.cpp"
               ,0x907,"","component is not in manifest.");
  }
  if (bIsDeleted == false) {
    ON_wString::ON_wString((ON_wString *)(local_80 + 0x18));
    bVar1 = NameIsSet(this);
    if (bVar1) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_model_component.cpp"
                 ,0x930,"","model_component name is already set");
      Name((ON_ModelComponent *)local_80);
      ON_wString::operator=((ON_wString *)(local_80 + 0x18),(ON_wString *)local_80);
      ON_wString::~ON_wString((ON_wString *)local_80);
    }
    else {
      bVar1 = DeletedNameIsSet(this);
      if (bVar1) {
        DeletedName((ON_ModelComponent *)&assigned_name);
        ON_wString::operator=((ON_wString *)(local_80 + 0x18),&assigned_name);
        ON_wString::~ON_wString(&assigned_name);
        bVar1 = UndeleteName(this);
        if (!bVar1) {
          ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_model_component.cpp"
                     ,0x938,"","cannot model_component deleted name cannot be restored.");
        }
      }
    }
    if ((local_41 & 1U) != 0) {
      bVar1 = ON_ComponentManifestItem::IsDeleted((ON_ComponentManifestItem *)local_30);
      if (bVar1) {
        ON_wString::ON_wString((ON_wString *)&undeleted_manifest_item);
        this_00 = pOStack_20;
        pOVar2 = Id(this);
        item_id = *pOVar2;
        pOVar2 = ParentId(this);
        parent_id = *pOVar2;
        OVar3 = RuntimeSerialNumber(this);
        pwVar4 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)(local_80 + 0x18));
        this_01 = ON_ComponentManifest::UndeleteComponentAndChangeRuntimeSerialNumber
                            (this_00,item_id,parent_id,OVar3,pwVar4,
                             (ON_wString *)&undeleted_manifest_item);
        bVar1 = ON_ComponentManifestItem::IsDeleted(this_01);
        if (bVar1) {
          ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_model_component.cpp"
                     ,0x951,"","unable to change manifest item deleted status to false.");
        }
        pwVar4 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)&undeleted_manifest_item);
        SetName(this,pwVar4);
        ON_wString::~ON_wString((ON_wString *)&undeleted_manifest_item);
      }
      else {
        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_model_component.cpp"
                   ,0x941,"","doc_manifest item deleted status is already false.");
      }
    }
    ON_wString::~ON_wString((ON_wString *)(local_80 + 0x18));
  }
  else {
    bVar1 = DeletedNameIsSet(this);
    if (bVar1) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_model_component.cpp"
                 ,0x90f,"","component name is already deleted");
    }
    else {
      bVar1 = NameIsSet(this);
      if ((bVar1) && (bVar1 = DeleteName(this), !bVar1)) {
        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_model_component.cpp"
                   ,0x915,"","component name cannot be deleted.");
      }
    }
    if ((local_41 & 1U) != 0) {
      bVar1 = ON_ComponentManifestItem::IsDeleted((ON_ComponentManifestItem *)local_30);
      if (bVar1) {
        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_model_component.cpp"
                   ,0x91e,"","manifest item deleted status is already true.");
      }
      else {
        candidate_name.m_s =
             (wchar_t *)
             ON_ComponentManifest::DeleteComponent(pOStack_20,this->m_runtime_serial_number);
        bVar1 = ON_ComponentManifestItem::IsDeleted((ON_ComponentManifestItem *)candidate_name.m_s);
        if (!bVar1) {
          ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_model_component.cpp"
                     ,0x925,"","unable to change manifest item deleted status to true.");
        }
      }
    }
  }
  bVar1 = IsDeleted(this);
  return bIsDeleted == bVar1;
}

Assistant:

bool ON_ModelComponent::SetDeletedModelComponentState(
  bool bDeleted,
  ON_ComponentManifest* manifest
  )
{
  bDeleted = bDeleted ? true : false; // ensure exact "true"
  ON_ComponentStatus component_status = ModelComponentStatus();
  if (bDeleted == component_status.IsDeleted())
  {
    // nothing to change
    ON_ERROR("model_component deleted status = bDeleted");
  }
  else
  {
    component_status.SetDeletedState(bDeleted);
    if (false == SetModelComponentStatus(component_status))
    {
      ON_ERROR("cannot change component deleted state.");
    }
  }

  const ON_ComponentManifestItem& manifest_item
    = (nullptr != manifest)
    ? ((bDeleted || ON_nil_uuid == m_component_id) ? manifest->ItemFromComponentRuntimeSerialNumber(m_runtime_serial_number) : manifest->ItemFromId(m_component_id))
    : ON_ComponentManifestItem::UnsetItem;
  
  const bool bComponentInManifest 
    = nullptr != manifest 
    && manifest_item.Id() == m_component_id
    && (false == bDeleted || manifest_item.ComponentRuntimeSerialNumber() == this->m_runtime_serial_number);
    
  if (nullptr != manifest && false == bComponentInManifest )
  {
    ON_ERROR("component is not in manifest.");
  }

  if (bDeleted)
  {
    // delete component name
    if (DeletedNameIsSet())
    {
      ON_ERROR("component name is already deleted");
    }
    else if (NameIsSet())
    {
      if (false == DeleteName())
      {
        ON_ERROR("component name cannot be deleted.");
      }
    }

    if (bComponentInManifest)
    {
      // delete manifest item
      if (manifest_item.IsDeleted())
      {
        ON_ERROR("manifest item deleted status is already true.");
      }
      else
      {
        const ON_ComponentManifestItem& deleted_manifest_item = manifest->DeleteComponent(m_runtime_serial_number);
        if (false == deleted_manifest_item.IsDeleted())
        {
          ON_ERROR("unable to change manifest item deleted status to true.");
        }
      }
    }
  }
  else
  {
    // undelete component name
    ON_wString candidate_name;
    if (NameIsSet())
    {
      ON_ERROR("model_component name is already set");
      candidate_name = Name();
    }
    else if (DeletedNameIsSet())
    {
      candidate_name = DeletedName();
      if (false == UndeleteName())
      {
        ON_ERROR("cannot model_component deleted name cannot be restored.");
      }
    }

    if (bComponentInManifest)
    {
      // undelete manifest item
      if (false == manifest_item.IsDeleted())
      {
        ON_ERROR("doc_manifest item deleted status is already false.");
      }
      else
      {
        // When an component is being replaced, it is common for the old an new component
        // to have the same id but different RuntimeSerialNumber() values.
        ON_wString assigned_name;
        const ON_ComponentManifestItem& undeleted_manifest_item = manifest->UndeleteComponentAndChangeRuntimeSerialNumber(
          Id(),
          ParentId(),
          RuntimeSerialNumber(),
          candidate_name,
          assigned_name
          );
        if (false != undeleted_manifest_item.IsDeleted())
        {
          ON_ERROR("unable to change manifest item deleted status to false.");
        }
        SetName(assigned_name);
      }
    }
  }

  return (bDeleted == IsDeleted());
}